

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

iterator __thiscall
QVLABase<QDialogButtonBox::ButtonRole>::erase
          (QVLABase<QDialogButtonBox::ButtonRole> *this,const_iterator abegin,const_iterator aend)

{
  const_iterator pBVar1;
  long lVar2;
  long lVar3;
  ButtonRole *pBVar4;
  ButtonRole *pBVar5;
  size_type sVar6;
  long in_RDX;
  long in_RSI;
  QVLABaseBase *in_RDI;
  qsizetype n;
  qsizetype l;
  qsizetype f;
  ButtonRole *in_stack_ffffffffffffff98;
  ButtonRole *in_stack_ffffffffffffffa0;
  ButtonRole *local_8;
  
  pBVar1 = cbegin((QVLABase<QDialogButtonBox::ButtonRole> *)0x675380);
  lVar2 = in_RSI - (long)pBVar1 >> 2;
  pBVar1 = cbegin((QVLABase<QDialogButtonBox::ButtonRole> *)0x6753a8);
  lVar3 = in_RDX - (long)pBVar1 >> 2;
  if (lVar3 - lVar2 == 0) {
    local_8 = data((QVLABase<QDialogButtonBox::ButtonRole> *)in_RDI);
  }
  else {
    std::destroy<QDialogButtonBox::ButtonRole_const*>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pBVar4 = data((QVLABase<QDialogButtonBox::ButtonRole> *)in_RDI);
    pBVar4 = pBVar4 + lVar2;
    pBVar5 = data((QVLABase<QDialogButtonBox::ButtonRole> *)in_RDI);
    sVar6 = QVLABaseBase::size(in_RDI);
    memmove(pBVar4,pBVar5 + lVar3,(sVar6 - lVar3) * 4);
    in_RDI->s = in_RDI->s - (lVar3 - lVar2);
    local_8 = data((QVLABase<QDialogButtonBox::ButtonRole> *)in_RDI);
  }
  local_8 = local_8 + lVar2;
  return local_8;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::erase(const_iterator abegin, const_iterator aend) -> iterator
{
    Q_ASSERT_X(isValidIterator(abegin), "QVarLengthArray::erase", "The specified const_iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QVarLengthArray::erase", "The specified const_iterator argument 'aend' is invalid");

    qsizetype f = qsizetype(abegin - cbegin());
    qsizetype l = qsizetype(aend - cbegin());
    qsizetype n = l - f;

    if (n == 0) // avoid UB in std::move() below
        return data() + f;

    Q_ASSERT(n > 0); // aend must be reachable from abegin

    if constexpr (!QTypeInfo<T>::isRelocatable) {
        std::move(begin() + l, end(), QT_MAKE_CHECKED_ARRAY_ITERATOR(begin() + f, size() - f));
        std::destroy(end() - n, end());
    } else {
        std::destroy(abegin, aend);
        memmove(static_cast<void *>(data() + f), static_cast<const void *>(data() + l), (size() - l) * sizeof(T));
    }
    this->s -= n;
    return data() + f;
}